

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_math.c
# Opt level: O1

_Bool math_min(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined6 in_register_00000012;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar4;
  ulong uVar5;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 *paVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  gravity_value_t value;
  gravity_class_t *pgVar6;
  
  iVar2 = (int)CONCAT62(in_register_00000012,nargs);
  if (iVar2 == 0) {
    uVar3 = 1;
    bVar1 = false;
LAB_00142449:
    if (bVar1) {
      aVar4 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
              ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)
              ((long)&args->field_1 + (ulong)(uVar3 << 4)))->n;
      pgVar6 = *(gravity_class_t **)((long)&args->isa + (ulong)(uVar3 << 4));
      goto LAB_0014246a;
    }
  }
  else if (iVar2 != 1) {
    paVar7 = &args[1].field_1;
    uVar5 = 1;
    dVar9 = 1.79769313486232e+308;
    uVar8 = 1;
    bVar1 = false;
    do {
      dVar10 = paVar7->f;
      if (((gravity_value_t *)(paVar7 + -1))->isa == gravity_class_int) {
        dVar10 = (double)(long)dVar10;
LAB_0014241c:
        bVar1 = true;
        if (dVar10 < dVar9) {
          uVar5 = uVar8 & 0xffffffff;
          dVar9 = dVar10;
        }
      }
      else if (((gravity_value_t *)(paVar7 + -1))->isa == gravity_class_float) goto LAB_0014241c;
      uVar8 = uVar8 + 1;
      paVar7 = paVar7 + 2;
    } while (nargs != uVar8);
    uVar3 = (uint)uVar5 & 0xffff;
    goto LAB_00142449;
  }
  aVar4.n = 0;
  pgVar6 = gravity_class_null;
LAB_0014246a:
  value.field_1.n = aVar4.n;
  value.isa = pgVar6;
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool math_min (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs == 1) RETURN_VALUE(VALUE_FROM_NULL, rindex);

    gravity_float_t n = GRAVITY_FLOAT_MAX;
    uint16_t minindex = 1;
    bool found = false;

    for (uint16_t i = 1; i<nargs; ++i) {
        gravity_value_t value = GET_VALUE(i);
        if (VALUE_ISA_INT(value)) {
            found = true;
            if ((gravity_float_t)value.n < n) {
                n = (gravity_float_t)value.n;
                minindex = i;
            }
        } else if (VALUE_ISA_FLOAT(value)) {
            found = true;
            if (value.f < n) {
                n = value.f;
                minindex = i;
            }
        } else continue;
    }

    if (!found) {
        RETURN_VALUE(VALUE_FROM_NULL, rindex);
    }

    RETURN_VALUE(GET_VALUE(minindex), rindex);
}